

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

expression_ptr __thiscall
mjs::parser::make_expression<mjs::identifier_expression,std::__cxx11::wstring>
          (parser *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args)

{
  long *plVar1;
  element_type *this_00;
  wstring *in_RDX;
  source_extend local_38;
  
  plVar1 = (long *)args[3]._M_string_length;
  if (plVar1 != (long *)0x0) {
    this_00 = (element_type *)operator_new(0x40);
    local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)*plVar1;
    local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((undefined8 *)*plVar1)[1];
    if (local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_38.start = *(uint32_t *)(plVar1 + 3);
    local_38.end = *(uint32_t *)(*plVar1 + 100);
    identifier_expression::identifier_expression((identifier_expression *)this_00,&local_38,in_RDX);
    (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this_00;
    if (local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
           (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
  }
  __assert_fail("expression_pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x13d,
                "expression_ptr mjs::parser::make_expression(Args &&...) [T = mjs::identifier_expression, Args = <std::basic_string<wchar_t>>]"
               );
}

Assistant:

expression_ptr make_expression(Args&&... args) {
        assert(expression_pos_);
        auto e = expression_ptr{new T{expression_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << e->extend() << " Producting: " << *e << "\n";
#endif
        return e;
    }